

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_3,_4>,_tcu::Vector<double,_3>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Matrix<double,_3,_4>,_tcu::Vector<double,_3>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  code *pcVar2;
  undefined8 uVar3;
  GLuint GVar4;
  undefined8 *puVar5;
  int row_1;
  undefined8 *puVar6;
  GLdouble *data;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  uint uVar11;
  Matrix<double,_3,_4> result;
  undefined8 local_128 [13];
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_80 [96];
  
  puVar6 = local_128;
  puVar5 = local_128;
  lVar9 = 0;
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar2 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  local_128[10] = 0;
  local_128[0xb] = 0;
  local_128[8] = 0;
  local_128[9] = 0;
  local_128[6] = 0;
  local_128[7] = 0;
  local_128[4] = 0;
  local_128[5] = 0;
  local_128[2] = 0;
  local_128[3] = 0;
  local_128[0] = 0;
  local_128[1] = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar11 = 0x3ff00000;
      if (lVar9 != lVar8) {
        uVar11 = 0;
      }
      *(ulong *)((long)puVar6 + lVar8) = (ulong)uVar11 << 0x20;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x60);
    lVar7 = lVar7 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 8);
    lVar9 = lVar9 + 0x18;
  } while (lVar7 != 3);
  local_b8 = *(undefined8 *)((long)argument_src + 0x10);
  local_128[0xc] = *argument_src;
  uStack_c0 = *(undefined8 *)((long)argument_src + 8);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar4);
  local_a8 = *puVar1;
  uStack_a4 = puVar1[1];
  uStack_a0 = puVar1[2];
  uStack_9c = puVar1[3];
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar4 + 0x10);
  local_98 = *puVar1;
  uStack_94 = puVar1[1];
  uStack_90 = puVar1[2];
  uStack_8c = puVar1[3];
  puVar10 = local_80;
  (*pcVar2)(puVar10);
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar5 + lVar9) = *(undefined8 *)(puVar10 + lVar9);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x60);
    lVar7 = lVar7 + 1;
    puVar5 = (undefined8 *)((long)puVar5 + 8);
    puVar10 = puVar10 + 8;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)result_dst + lVar7 + 0x10) =
         *(undefined8 *)((long)local_128 + lVar7 + 0x10);
    uVar3 = *(undefined8 *)((long)local_128 + lVar7 + 8);
    *(undefined8 *)((long)result_dst + lVar7) = *(undefined8 *)((long)local_128 + lVar7);
    ((undefined8 *)((long)result_dst + lVar7))[1] = uVar3;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x60);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}